

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

GLenum __thiscall
gl4cts::DirectStateAccess::Textures::CreationErrorsTest::NotATarget(CreationErrorsTest *this)

{
  ulong uVar1;
  GLenum GVar2;
  ulong uVar3;
  
  GVar2 = 0;
  do {
    do {
      GVar2 = GVar2 + 1;
    } while (GVar2 == 0xde0);
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      if (uVar3 == 10) break;
      uVar1 = uVar3 + 1;
    } while (Textures::CreationTest::iterate::texture_targets[uVar3 + 1] != GVar2);
    if (9 < uVar3) {
      return GVar2;
    }
  } while( true );
}

Assistant:

glw::GLenum CreationErrorsTest::NotATarget()
{
	static const glw::GLenum texture_targets[] = { GL_TEXTURE_1D,
												   GL_TEXTURE_2D,
												   GL_TEXTURE_3D,
												   GL_TEXTURE_1D_ARRAY,
												   GL_TEXTURE_2D_ARRAY,
												   GL_TEXTURE_RECTANGLE,
												   GL_TEXTURE_CUBE_MAP,
												   GL_TEXTURE_CUBE_MAP_ARRAY,
												   GL_TEXTURE_BUFFER,
												   GL_TEXTURE_2D_MULTISAMPLE,
												   GL_TEXTURE_2D_MULTISAMPLE_ARRAY };

	glw::GLenum not_a_target = 0;
	bool		is_target	= true;

	while (is_target)
	{
		not_a_target++;

		is_target = false;

		for (glw::GLuint i = 0; i < sizeof(texture_targets) / sizeof(texture_targets[0]); ++i)
		{
			if (texture_targets[i] == not_a_target)
			{
				is_target = true;
				break;
			}
		}
	}

	return not_a_target;
}